

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O1

uintptr_t ht_feature_cached_string_add_mapping_dynamic(HT_Timeline *timeline,char *label)

{
  HT_Feature *pHVar1;
  pthread_mutex_t *__mutex;
  char cVar2;
  size_t __n;
  char *pcVar3;
  uint uVar4;
  uint64_t key;
  
  pHVar1 = timeline->features[(uint)HT_FeatureCachedString_get_class()::feature_klass._8_4_];
  if (pHVar1 != (HT_Feature *)0x0) {
    cVar2 = *label;
    if (cVar2 == '\0') {
      key = 0x1505;
    }
    else {
      pcVar3 = label + 1;
      uVar4 = 0x1505;
      do {
        uVar4 = (int)cVar2 + uVar4 * 0x21;
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar2 != '\0');
      key = (uint64_t)uVar4;
    }
    if (pHVar1[1].klass != (HT_FeatureKlass *)0x0) {
      ht_mutex_lock((HT_Mutex *)pHVar1[1].klass);
    }
    pcVar3 = ht_hash_map_get_value((HT_HashMap *)(pHVar1 + 2),key);
    __mutex = (pthread_mutex_t *)pHVar1[1].klass;
    if (pcVar3 == (char *)0x0) {
      if (__mutex != (pthread_mutex_t *)0x0) {
        pthread_mutex_unlock(__mutex);
      }
      __n = strlen(label);
      if (realloc_fnc_ == (realloc_function)0x0) {
        pcVar3 = (char *)malloc(__n + 1);
      }
      else {
        pcVar3 = (char *)(*realloc_fnc_)((void *)0x0,__n + 1,user_data_);
      }
      memcpy(pcVar3,label,__n);
      pcVar3[__n] = '\0';
      ht_feature_cached_string_add_mapping_(timeline,(HT_HashMap *)(pHVar1 + 2),key,pcVar3);
    }
    else if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
    return key;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O1/hawktracer.cpp"
                ,0x989,
                "uintptr_t ht_feature_cached_string_add_mapping_dynamic(HT_Timeline *, const char *)"
               );
}

Assistant:

uintptr_t
ht_feature_cached_string_add_mapping_dynamic(HT_Timeline* timeline, const char* label)
{
    HT_FeatureCachedString* f = HT_FeatureCachedString_from_timeline(timeline);
    uintptr_t hash_value;

    assert(f);

    hash_value = djb2_hash(label);

    HT_FCS_LOCK_(f);

    if (ht_hash_map_get_value(&f->dynamic_hashes, hash_value) == NULL)
    {
        HT_FCS_UNLOCK_(f);

        size_t label_len = strlen(label);
        char* new_label = (char*)ht_alloc(label_len + 1);
        memcpy(new_label, label, label_len);
        new_label[label_len] = 0;

        ht_feature_cached_string_add_mapping_(timeline, &f->dynamic_hashes, hash_value, new_label);
    }
    else
    {
        HT_FCS_UNLOCK_(f);
    }

    return hash_value;
}